

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3TableLock(Parse *pParse,int iDb,int iTab,u8 isWriteLock,char *zName)

{
  int iVar1;
  TableLock *pTVar2;
  long lVar3;
  Parse *pPVar4;
  
  pPVar4 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar4 = pParse;
  }
  if ((iDb != 1) && ((pParse->db->aDb[iDb].pBt)->sharable != '\0')) {
    iVar1 = pPVar4->nTableLock;
    if (0 < (long)iVar1) {
      pTVar2 = pPVar4->aTableLock;
      lVar3 = 0;
      do {
        if ((*(int *)((long)&pTVar2->iDb + lVar3) == iDb) &&
           (*(int *)((long)&pTVar2->iTab + lVar3) == iTab)) {
          (&pTVar2->isWriteLock)[lVar3] =
               isWriteLock != '\0' || (&pTVar2->isWriteLock)[lVar3] != '\0';
          return;
        }
        lVar3 = lVar3 + 0x18;
      } while ((long)iVar1 * 0x18 != lVar3);
    }
    pTVar2 = (TableLock *)
             sqlite3DbReallocOrFree(pPVar4->db,pPVar4->aTableLock,(long)(iVar1 * 0x18 + 0x18));
    pPVar4->aTableLock = pTVar2;
    if (pTVar2 == (TableLock *)0x0) {
      pPVar4->nTableLock = 0;
      sqlite3OomFault(pPVar4->db);
      return;
    }
    iVar1 = pPVar4->nTableLock;
    pPVar4->nTableLock = iVar1 + 1;
    pTVar2[iVar1].iDb = iDb;
    pTVar2[iVar1].iTab = iTab;
    pTVar2[iVar1].isWriteLock = isWriteLock;
    pTVar2[iVar1].zLockName = zName;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableLock(
  Parse *pParse,     /* Parsing context */
  int iDb,           /* Index of the database containing the table to lock */
  int iTab,          /* Root page number of the table to be locked */
  u8 isWriteLock,    /* True for a write lock */
  const char *zName  /* Name of the table to be locked */
){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  int i;
  int nBytes;
  TableLock *p;
  assert( iDb>=0 );

  if( iDb==1 ) return;
  if( !sqlite3BtreeSharable(pParse->db->aDb[iDb].pBt) ) return;
  for(i=0; i<pToplevel->nTableLock; i++){
    p = &pToplevel->aTableLock[i];
    if( p->iDb==iDb && p->iTab==iTab ){
      p->isWriteLock = (p->isWriteLock || isWriteLock);
      return;
    }
  }

  nBytes = sizeof(TableLock) * (pToplevel->nTableLock+1);
  pToplevel->aTableLock =
      sqlite3DbReallocOrFree(pToplevel->db, pToplevel->aTableLock, nBytes);
  if( pToplevel->aTableLock ){
    p = &pToplevel->aTableLock[pToplevel->nTableLock++];
    p->iDb = iDb;
    p->iTab = iTab;
    p->isWriteLock = isWriteLock;
    p->zLockName = zName;
  }else{
    pToplevel->nTableLock = 0;
    sqlite3OomFault(pToplevel->db);
  }
}